

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_scalbn_mipsel(floatx80 a,int n,float_status *status)

{
  unkuint10 Var1;
  _Bool _Var2;
  flag zSign;
  uint64_t zSig0;
  uint16_t uVar3;
  undefined8 extraout_RDX;
  floatx80 b;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 fVar4;
  floatx80 fVar5;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  int n_local;
  floatx80 a_local;
  
  uVar3 = a.high;
  Var1 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var1;
  a_00.high = (short)(Var1 >> 0x40);
  _Var2 = floatx80_invalid_encoding(a_00);
  if (_Var2) {
    float_raise_mipsel('\x01',status);
    fVar4 = floatx80_default_nan_mipsel(status);
    uVar3 = fVar4.high;
  }
  else {
    a_01._10_6_ = 0;
    a_01.low = (long)Var1;
    a_01.high = (short)(Var1 >> 0x40);
    zSig0 = extractFloatx80Frac(a_01);
    a_02._10_6_ = 0;
    a_02.low = (long)Var1;
    a_02.high = (short)(Var1 >> 0x40);
    aSig._0_4_ = extractFloatx80Exp(a_02);
    a_03._10_6_ = 0;
    a_03.low = (long)Var1;
    a_03.high = (short)(Var1 >> 0x40);
    zSign = extractFloatx80Sign(a_03);
    if ((int32_t)aSig == 0x7fff) {
      if ((zSig0 & 0x7fffffffffffffff) == 0) {
        fVar4._8_8_ = extraout_RDX;
        fVar4.low = a.low;
      }
      else {
        b._10_6_ = 0;
        b.low = (long)Var1;
        b.high = (short)(Var1 >> 0x40);
        a_04._10_6_ = 0;
        a_04.low = (long)Var1;
        a_04.high = (short)(Var1 >> 0x40);
        fVar4 = propagateFloatx80NaN_mipsel(a_04,b,status);
        uVar3 = fVar4.high;
      }
    }
    else {
      if ((int32_t)aSig == 0) {
        if (zSig0 == 0) {
          fVar4._8_8_ = extraout_RDX;
          fVar4.low = a.low;
          goto LAB_00a2abca;
        }
        aSig._0_4_ = 1;
      }
      if (n < 0x10001) {
        status_local._4_4_ = n;
        if (n < -0x10000) {
          status_local._4_4_ = -0x10000;
        }
      }
      else {
        status_local._4_4_ = 0x10000;
      }
      fVar4 = normalizeRoundAndPackFloatx80_mipsel
                        (status->floatx80_rounding_precision,zSign,
                         status_local._4_4_ + (int32_t)aSig,zSig0,0,status);
      uVar3 = fVar4.high;
    }
  }
LAB_00a2abca:
  a_local._8_8_ = fVar4.low;
  fVar5._10_6_ = fVar4._10_6_;
  fVar5.high = uVar3;
  fVar5.low = a_local._8_8_;
  return fVar5;
}

Assistant:

floatx80 floatx80_scalbn(floatx80 a, int n, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );

    if ( aExp == 0x7FFF ) {
        if ( aSig<<1 ) {
            return propagateFloatx80NaN(a, a, status);
        }
        return a;
    }

    if (aExp == 0) {
        if (aSig == 0) {
            return a;
        }
        aExp++;
    }

    if (n > 0x10000) {
        n = 0x10000;
    } else if (n < -0x10000) {
        n = -0x10000;
    }

    aExp += n;
    return normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                         aSign, aExp, aSig, 0, status);
}